

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  int in_ESI;
  ImGuiInputEvent e;
  ImGuiContext *g;
  ImGuiInputEvent *in_stack_ffffffffffffffc8;
  
  if (in_ESI != 0) {
    ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)0x11044c);
    ImVector<ImGuiInputEvent>::push_back
              ((ImVector<ImGuiInputEvent> *)0x200000005,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (c == 0)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Text;
    e.Source = ImGuiInputSource_Keyboard;
    e.Text.Char = c;
    g.InputEventsQueue.push_back(e);
}